

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_CCtx_params * ZSTD_createCCtxParams(void)

{
  ZSTD_CCtx_params *pZVar1;
  
  pZVar1 = (ZSTD_CCtx_params *)calloc(1,0x90);
  if (pZVar1 != (ZSTD_CCtx_params *)0x0) {
    pZVar1->compressionLevel = 3;
    (pZVar1->fParams).contentSizeFlag = 1;
  }
  return pZVar1;
}

Assistant:

ZSTD_CCtx_params* ZSTD_createCCtxParams(void)
{
    return ZSTD_createCCtxParams_advanced(ZSTD_defaultCMem);
}